

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unsimplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  uint *puVar1;
  pointer pnVar2;
  long *plVar3;
  pointer pnVar4;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar5;
  bool bVar6;
  SPxOut *pSVar7;
  fpclass_type *pfVar8;
  ulong uVar9;
  long lVar10;
  int j;
  long lVar11;
  int i;
  Verbosity old_verbosity;
  uint uStack_2a4;
  uint auStack_2a0 [2];
  uint local_298 [2];
  uint auStack_290 [2];
  uint local_288 [2];
  uint local_280;
  bool local_27c;
  fpclass_type local_278;
  int32_t iStack_274;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_268;
  undefined4 local_25c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_258;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_250;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_248;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_240;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_238;
  VarStatus *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pSVar7 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  local_268 = (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)y;
  local_258 = s;
  local_230 = rows;
  if ((pSVar7 != (SPxOut *)0x0) && (2 < (int)pSVar7->m_verbosity)) {
    old_verbosity = pSVar7->m_verbosity;
    local_25c = 3;
    (*pSVar7->_vptr_SPxOut[2])();
    pSVar7 = soplex::operator<<((this->
                                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout," --- unsimplifying solution and basis");
    std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
    pSVar7 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar7->_vptr_SPxOut[2])(pSVar7,&old_verbosity);
  }
  local_250 = &this->m_prim;
  local_248 = &this->m_redCost;
  lVar10 = 0xc;
  lVar11 = 0;
  while( true ) {
    pnVar2 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(x->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar2) / 0x38) <= lVar11)
    break;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_168.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar2->m_backend).data._M_elems + lVar10 + -4);
    local_168.m_backend.exp = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
    local_168.m_backend.neg = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    local_168.m_backend.fpclass = puVar1[0];
    local_168.m_backend.prec_elem = puVar1[1];
    epsZero(&local_68,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_168,&local_68);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      pnVar2 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_288 = *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
      _old_verbosity = *(undefined8 *)puVar1;
      auStack_2a0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
      local_298 = *(uint (*) [2])puVar1;
      auStack_290 = *(uint (*) [2])(puVar1 + 2);
      local_280 = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
      local_27c = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
      local_278 = puVar1[0];
      iStack_274 = puVar1[1];
    }
    pnVar2 = (this->m_prim).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4) = local_288;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    *(uint (*) [2])puVar1 = local_298;
    *(uint (*) [2])(puVar1 + 2) = auStack_290;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    *(undefined8 *)puVar1 = _old_verbosity;
    *(uint (*) [2])(puVar1 + 2) = auStack_2a0;
    (pnVar2->m_backend).data._M_elems[lVar10 + -2] = local_280;
    *(bool *)((pnVar2->m_backend).data._M_elems + lVar10 + -1) = local_27c;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    puVar1[0] = local_278;
    puVar1[1] = iStack_274;
    pnVar2 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar2->m_backend).data._M_elems + lVar10 + -4);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1a8.m_backend.exp = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
    local_1a8.m_backend.neg = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    local_1a8.m_backend.fpclass = puVar1[0];
    local_1a8.m_backend.prec_elem = puVar1[1];
    epsZero(&local_a0,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1a8,&local_a0);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      pnVar2 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_288 = *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
      _old_verbosity = *(undefined8 *)puVar1;
      auStack_2a0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
      local_298 = *(uint (*) [2])puVar1;
      auStack_290 = *(uint (*) [2])(puVar1 + 2);
      local_280 = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
      local_27c = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
      local_278 = puVar1[0];
      iStack_274 = puVar1[1];
      if ((this->m_thesense == MAXIMIZE) &&
         (local_278 != cpp_dec_float_finite || old_verbosity != ERROR)) {
        local_27c = (bool)(local_27c ^ 1);
      }
    }
    pnVar2 = (this->m_redCost).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4) = local_288;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    *(uint (*) [2])puVar1 = local_298;
    *(uint (*) [2])(puVar1 + 2) = auStack_290;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    *(undefined8 *)puVar1 = _old_verbosity;
    *(uint (*) [2])(puVar1 + 2) = auStack_2a0;
    (pnVar2->m_backend).data._M_elems[lVar10 + -2] = local_280;
    *(bool *)((pnVar2->m_backend).data._M_elems + lVar10 + -1) = local_27c;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    puVar1[0] = local_278;
    puVar1[1] = iStack_274;
    (this->m_cBasisStat).data[lVar11] = cols[lVar11];
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0xe;
  }
  local_238 = &this->m_dual;
  local_240 = &this->m_slack;
  lVar10 = 0xc;
  lVar11 = 0;
  while( true ) {
    pnVar2 = (((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_268->thesize)->
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)&local_268->thesize)->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar2) / 0x38) <= lVar11)
    break;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar2->m_backend).data._M_elems + lVar10 + -4);
    local_1e8.m_backend.exp = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
    local_1e8.m_backend.neg = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    local_1e8.m_backend.fpclass = puVar1[0];
    local_1e8.m_backend.prec_elem = puVar1[1];
    epsZero(&local_d8,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1e8,&local_d8);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      pnVar2 = (((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)&local_268->thesize)->
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_288 = *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
      _old_verbosity = *(undefined8 *)puVar1;
      auStack_2a0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
      local_298 = *(uint (*) [2])puVar1;
      auStack_290 = *(uint (*) [2])(puVar1 + 2);
      local_280 = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
      local_27c = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
      local_278 = puVar1[0];
      iStack_274 = puVar1[1];
      if ((this->m_thesense == MAXIMIZE) &&
         (local_278 != cpp_dec_float_finite || old_verbosity != ERROR)) {
        local_27c = (bool)(local_27c ^ 1);
      }
    }
    pVVar5 = local_258;
    pnVar2 = (this->m_dual).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4) = local_288;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    *(uint (*) [2])puVar1 = local_298;
    *(uint (*) [2])(puVar1 + 2) = auStack_290;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    *(undefined8 *)puVar1 = _old_verbosity;
    *(uint (*) [2])(puVar1 + 2) = auStack_2a0;
    (pnVar2->m_backend).data._M_elems[lVar10 + -2] = local_280;
    *(bool *)((pnVar2->m_backend).data._M_elems + lVar10 + -1) = local_27c;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    puVar1[0] = local_278;
    puVar1[1] = iStack_274;
    pnVar2 = (local_258->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_228.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar2->m_backend).data._M_elems + lVar10 + -4);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_228.m_backend.exp = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
    local_228.m_backend.neg = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    local_228.m_backend.fpclass = puVar1[0];
    local_228.m_backend.prec_elem = puVar1[1];
    epsZero(&local_110,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_228,&local_110);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      pnVar2 = (pVVar5->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_288 = *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
      _old_verbosity = *(undefined8 *)puVar1;
      auStack_2a0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
      local_298 = *(uint (*) [2])puVar1;
      auStack_290 = *(uint (*) [2])(puVar1 + 2);
      local_280 = (pnVar2->m_backend).data._M_elems[lVar10 + -2];
      local_27c = SUB41((pnVar2->m_backend).data._M_elems[lVar10 + -1],0);
      puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
      local_278 = puVar1[0];
      iStack_274 = puVar1[1];
    }
    pnVar2 = (this->m_slack).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(uint (*) [2])((pnVar2->m_backend).data._M_elems + lVar10 + -4) = local_288;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -8;
    *(uint (*) [2])puVar1 = local_298;
    *(uint (*) [2])(puVar1 + 2) = auStack_290;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10 + -0xc;
    *(undefined8 *)puVar1 = _old_verbosity;
    *(uint (*) [2])(puVar1 + 2) = auStack_2a0;
    (pnVar2->m_backend).data._M_elems[lVar10 + -2] = local_280;
    *(bool *)((pnVar2->m_backend).data._M_elems + lVar10 + -1) = local_27c;
    puVar1 = (pnVar2->m_backend).data._M_elems + lVar10;
    puVar1[0] = local_278;
    puVar1[1] = iStack_274;
    (this->m_rBasisStat).data[lVar11] = local_230[lVar11];
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0xe;
  }
  this_00 = &this->m_hist;
  local_268 = &this->m_cBasisStat;
  uVar9 = (ulong)((long)(this->m_hist).data.
                        super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_hist).data.
                       super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  while (0 < (int)uVar9) {
    uVar9 = uVar9 - 1;
    (**(code **)(*(long *)(this_00->data).
                          super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar9 & 0xffffffff].
                          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x10))();
    plVar3 = (long *)(this_00->data).
                     super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9 & 0xffffffff].
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
    (**(code **)(*plVar3 + 0x20))
              (plVar3,local_250,local_238,local_240,local_248,local_268,&this->m_rBasisStat,
               isOptimal);
    Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
    ::reSize(this_00,(int)uVar9);
  }
  if (this->m_thesense == MAXIMIZE) {
    pnVar2 = (this->m_redCost).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (this->m_redCost).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pfVar8 = &(pnVar2->m_backend).fpclass;
    for (lVar10 = 0; lVar10 < (int)(((long)pnVar4 - (long)pnVar2) / 0x38); lVar10 = lVar10 + 1) {
      *(char *)(pfVar8 + -1) =
           *(bool *)(pfVar8 + -1) ^
           ((((cpp_dec_float<50U,_int,_void> *)(pfVar8 + -0xc))->data)._M_elems[0] != 0 ||
           *pfVar8 != cpp_dec_float_finite);
      pfVar8 = pfVar8 + 0xe;
    }
    pnVar2 = (this->m_dual).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (this->m_dual).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pfVar8 = &(pnVar2->m_backend).fpclass;
    for (lVar10 = 0; lVar10 < (int)(((long)pnVar4 - (long)pnVar2) / 0x38); lVar10 = lVar10 + 1) {
      *(char *)(pfVar8 + -1) =
           *(bool *)(pfVar8 + -1) ^
           ((((cpp_dec_float<50U,_int,_void> *)(pfVar8 + -0xc))->data)._M_elems[0] != 0 ||
           *pfVar8 != cpp_dec_float_finite);
      pfVar8 = pfVar8 + 0xe;
    }
  }
  if (0 < this->m_addedcols) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(local_250,
            (int)(((long)(this->m_prim).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_prim).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38) - this->m_addedcols,true)
    ;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(local_248,
            (int)(((long)(this->m_redCost).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_redCost).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38) - this->m_addedcols,true)
    ;
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(local_268,(this->m_cBasisStat).thesize - this->m_addedcols);
    DataArray<int>::reSize(&this->m_cIdx,(this->m_cIdx).thesize - this->m_addedcols);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::clear(&this_00->data);
  this->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}